

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::ParseLoopPreserveNone
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcParseTableBase *table)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ushort *local_28;
  
  local_28 = (ushort *)ptr;
  while (bVar1 = EpsCopyInputStream::DoneWithCheck
                           (&ctx->super_EpsCopyInputStream,(char **)&local_28,ctx->group_depth_),
        !bVar1) {
    uVar2 = (uint)table->fast_idx_mask & (uint)*local_28;
    if ((uVar2 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    uVar3 = (ulong)(uVar2 & 0xfffffff8);
    local_28 = (ushort *)
               (**(code **)(&table[1].has_bits_offset + uVar3))
                         (msg,local_28,ctx,
                          (ulong)*local_28 ^ *(ulong *)(&table[1].fast_idx_mask + uVar3 * 2),table,0
                         );
    if ((local_28 == (ushort *)0x0) || ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0))
    break;
  }
  if ((table->field_0x9 & 1) != 0) {
    local_28 = (ushort *)(*table->post_loop_handler)(msg,(char *)local_28,ctx);
  }
  return (char *)local_28;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::ParseLoopPreserveNone(
    MessageLite* msg, const char* ptr, ParseContext* ctx,
    const TcParseTableBase* table) {
  return ParseLoop(msg, ptr, ctx, table);
}